

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix4d * tinyusdz::upper_left_3x3_only(matrix4d *__return_storage_ptr__,matrix4d *m)

{
  long lVar1;
  double *pdVar2;
  
  pdVar2 = (double *)__return_storage_ptr__;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar2 = *(double *)m;
    m = (matrix4d *)((long)m + 8);
    pdVar2 = pdVar2 + 1;
  }
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d upper_left_3x3_only(const value::matrix4d &m) {
  value::matrix4d dst;

  memcpy(dst.m, m.m, sizeof(double) * 4 * 4);

  dst.m[0][3] = 0.0;
  dst.m[0][3] = 0.0;
  dst.m[0][3] = 0.0;

  dst.m[3][0] = 0.0;
  dst.m[3][1] = 0.0;
  dst.m[3][2] = 0.0;

  dst.m[3][3] = 1.0;

  return dst;
}